

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

int __thiscall
kratos::ScopedStmtBlock::clone
          (ScopedStmtBlock *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  StmtBlock *local_38;
  pointer local_30;
  undefined1 local_21;
  
  std::__shared_ptr<kratos::ScopedStmtBlock,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<kratos::ScopedStmtBlock>>
            ((__shared_ptr<kratos::ScopedStmtBlock,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (allocator<kratos::ScopedStmtBlock> *)&local_21);
  StmtBlock::clone_block((StmtBlock *)__fn,local_38);
  (this->super_StmtBlock).super_Stmt.super_IRNode._vptr_IRNode = (_func_int **)local_38;
  (this->super_StmtBlock).super_Stmt.super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_30;
  return (int)this;
}

Assistant:

std::shared_ptr<Stmt> ScopedStmtBlock::clone() const {
    auto stmt = std::make_shared<ScopedStmtBlock>();
    clone_block(stmt.get());
    return stmt;
}